

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Approvals.h
# Opt level: O2

void ApprovalTests::
     TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>::
     verifyExistingFile(string *filePath,Options *options)

{
  Reporter *siglen;
  uchar *in_RCX;
  size_t in_R8;
  ExistingFile writer;
  string sStack_98;
  ExistingFile local_78;
  ExistingFileNamer local_40;
  
  ::std::__cxx11::string::string((string *)&sStack_98,(string *)filePath);
  ExistingFile::ExistingFile(&local_78,&sStack_98,options);
  ::std::__cxx11::string::~string((string *)&sStack_98);
  ExistingFile::getNamer(&local_40,&local_78);
  siglen = Options::getReporter(options);
  FileApprover::verify((EVP_PKEY_CTX *)&local_40,(uchar *)&local_78,(size_t)siglen,in_RCX,in_R8);
  ExistingFileNamer::~ExistingFileNamer(&local_40);
  ExistingFile::~ExistingFile(&local_78);
  return;
}

Assistant:

static void verifyExistingFile(const std::string& filePath,
                                       const Options& options = Options())
        {
            ExistingFile writer(filePath, options);
            FileApprover::verify(writer.getNamer(), writer, options.getReporter());
        }